

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_dup8i_vec_x86_64(TCGContext *tcg_ctx,TCGv_vec r,uint32_t a)

{
  TCGArg in_RCX;
  
  do_dupi_vec(tcg_ctx,r,(a & 0xff) * 0x1010101,in_RCX);
  return;
}

Assistant:

void tcg_gen_dup8i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint32_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(MO_8, a));
}